

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalNinjaGenerator::AppendCustomCommandLines
          (cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  uint uVar3;
  uint uVar4;
  OutputFormat OVar5;
  ostream *poVar6;
  string_view source;
  string_view source_00;
  string wd;
  string cdStr;
  string launcher;
  string local_210;
  string local_1f0;
  cmGlobalGenerator *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostream local_1a8;
  
  local_1d0 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  uVar3 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
  if (uVar3 != 0) {
    cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_1f0,ccg);
    if (local_1f0._M_string_length == 0) {
      cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      std::__cxx11::string::_M_assign((string *)&local_1f0);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"cd ",(allocator<char> *)&local_210);
    poVar6 = std::operator<<(&local_1a8,(string *)&local_1c8);
    source._M_str = local_1f0._M_dataplus._M_p;
    source._M_len = local_1f0._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_210,(cmOutputConverter *)this,source,SHELL,false);
    std::operator<<(poVar6,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)cmdLines,
               &local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  MakeCustomLauncher_abi_cxx11_((string *)&local_1a8,this,ccg);
  uVar3 = 0;
  while( true ) {
    uVar4 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    if (uVar3 == uVar4) break;
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&local_1f0,ccg,uVar3);
    sVar2 = local_1f0._M_string_length;
    _Var1._M_p = local_1f0._M_dataplus._M_p;
    if (local_1f0._M_string_length != 0) {
      OVar5 = (*local_1d0->_vptr_cmGlobalGenerator[0x28])();
      source_00._M_str = _Var1._M_p;
      source_00._M_len = sVar2;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_210,(cmOutputConverter *)this,source_00,OVar5 & 0xff,false);
      std::operator+(&local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8
                     ,&local_210);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)cmdLines,
                 &local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_210);
      cmCustomCommandGenerator::AppendArguments
                (ccg,uVar3,
                 (cmdLines->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::~string((string *)&local_1a8);
  return;
}

Assistant:

void cmLocalNinjaGenerator::AppendCustomCommandLines(
  cmCustomCommandGenerator const& ccg, std::vector<std::string>& cmdLines)
{
  auto* gg = this->GetGlobalNinjaGenerator();

  if (ccg.GetNumberOfCommands() > 0) {
    std::string wd = ccg.GetWorkingDirectory();
    if (wd.empty()) {
      wd = this->GetCurrentBinaryDirectory();
    }

    std::ostringstream cdCmd;
#ifdef _WIN32
    std::string cdStr = "cd /D ";
#else
    std::string cdStr = "cd ";
#endif
    cdCmd << cdStr
          << this->ConvertToOutputFormat(wd, cmOutputConverter::SHELL);
    cmdLines.push_back(cdCmd.str());
  }

  std::string launcher = this->MakeCustomLauncher(ccg);

  for (unsigned i = 0; i != ccg.GetNumberOfCommands(); ++i) {
    std::string c = ccg.GetCommand(i);
    if (c.empty()) {
      continue;
    }
    cmdLines.push_back(launcher +
                       this->ConvertToOutputFormat(
                         c,
                         gg->IsMultiConfig() ? cmOutputConverter::NINJAMULTI
                                             : cmOutputConverter::SHELL));

    std::string& cmd = cmdLines.back();
    ccg.AppendArguments(i, cmd);
  }
}